

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O3

int cgltf_parse_json_cameras
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_data *out_data)

{
  cgltf_size *out_extensions_count;
  cgltf_extension **out_extensions;
  jsmntok_t *pjVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  cgltf_camera_type cVar5;
  int iVar6;
  ulong uVar7;
  cgltf_size *out_array;
  int iVar8;
  cgltf_float cVar9;
  cgltf_size *in_stack_ffffffffffffff88;
  cgltf_camera *out_string;
  ulong local_68;
  
  out_array = &out_data->cameras_count;
  uVar3 = cgltf_parse_json_array
                    (options,tokens,i,(uint8_t *)0x50,(size_t)&out_data->cameras,(void **)out_array,
                     in_stack_ffffffffffffff88);
  if ((-1 < (int)uVar3) && (uVar7 = *out_array, uVar7 != 0)) {
    local_68 = 0;
    while (tokens[uVar3].type == JSMN_OBJECT) {
      iVar2 = tokens[uVar3].size;
      uVar3 = uVar3 + 1;
      if (0 < iVar2) {
        out_string = out_data->cameras + local_68;
        out_extensions_count = &out_string->extensions_count;
        out_extensions = &out_string->extensions;
        iVar8 = 0;
        do {
          if ((tokens[uVar3].type != JSMN_STRING) || (pjVar1 = tokens + uVar3, pjVar1->size == 0))
          goto LAB_00111730;
          iVar4 = cgltf_json_strcmp(pjVar1,json_chunk,"name");
          if (iVar4 == 0) {
            uVar3 = cgltf_parse_json_string(options,tokens,uVar3 + 1,json_chunk,&out_string->name);
LAB_001116f7:
            if ((int)uVar3 < 0) {
              return uVar3;
            }
          }
          else {
            iVar4 = cgltf_json_strcmp(pjVar1,json_chunk,"type");
            if (iVar4 == 0) {
              iVar4 = cgltf_json_strcmp(tokens + (ulong)uVar3 + 1,json_chunk,"perspective");
              if (iVar4 == 0) {
                cVar5 = cgltf_camera_type_perspective;
LAB_001116a0:
                out_string->type = cVar5;
              }
              else {
                iVar4 = cgltf_json_strcmp(tokens + (ulong)uVar3 + 1,json_chunk,"orthographic");
                if (iVar4 == 0) {
                  cVar5 = cgltf_camera_type_orthographic;
                  goto LAB_001116a0;
                }
              }
              uVar3 = uVar3 + 2;
            }
            else {
              iVar4 = cgltf_json_strcmp(pjVar1,json_chunk,"perspective");
              if (iVar4 == 0) {
                if (pjVar1[1].type != JSMN_OBJECT) goto LAB_00111730;
                iVar4 = pjVar1[1].size;
                uVar3 = uVar3 + 2;
                out_string->type = cgltf_camera_type_perspective;
                if (0 < iVar4) {
                  do {
                    if ((tokens[uVar3].type != JSMN_STRING) ||
                       (pjVar1 = tokens + uVar3, pjVar1->size == 0)) goto LAB_00111730;
                    iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"aspectRatio");
                    if (iVar6 == 0) {
                      cVar9 = cgltf_json_to_float(tokens + (ulong)uVar3 + 1,json_chunk);
                      (out_string->data).perspective.aspect_ratio = cVar9;
LAB_001114f4:
                      uVar3 = uVar3 + 2;
                    }
                    else {
                      iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"yfov");
                      if (iVar6 == 0) {
                        cVar9 = cgltf_json_to_float(tokens + (ulong)uVar3 + 1,json_chunk);
                        (out_string->data).perspective.yfov = cVar9;
                        goto LAB_001114f4;
                      }
                      iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"zfar");
                      if (iVar6 == 0) {
                        cVar9 = cgltf_json_to_float(tokens + (ulong)uVar3 + 1,json_chunk);
                        (out_string->data).perspective.zfar = cVar9;
                        goto LAB_001114f4;
                      }
                      iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"znear");
                      if (iVar6 == 0) {
                        cVar9 = cgltf_json_to_float(tokens + (ulong)uVar3 + 1,json_chunk);
                        (out_string->data).perspective.znear = cVar9;
                        goto LAB_001114f4;
                      }
                      iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"extras");
                      uVar3 = uVar3 + 1;
                      if (iVar6 == 0) {
                        *(long *)((long)&out_string->data + 0x10) = (long)tokens[uVar3].start;
                        *(long *)((long)&out_string->data + 0x18) = (long)tokens[uVar3].end;
                      }
                      uVar3 = cgltf_skip_json(tokens,uVar3);
                      if ((int)uVar3 < 0) {
                        return uVar3;
                      }
                    }
                    iVar4 = iVar4 + -1;
                  } while (iVar4 != 0);
                }
              }
              else {
                iVar4 = cgltf_json_strcmp(pjVar1,json_chunk,"orthographic");
                if (iVar4 != 0) {
                  iVar4 = cgltf_json_strcmp(pjVar1,json_chunk,"extras");
                  if (iVar4 == 0) {
                    (out_string->extras).start_offset = (long)tokens[uVar3 + 1].start;
                    (out_string->extras).end_offset = (long)tokens[uVar3 + 1].end;
                  }
                  else {
                    iVar4 = cgltf_json_strcmp(pjVar1,json_chunk,"extensions");
                    if (iVar4 == 0) {
                      uVar3 = cgltf_parse_json_unprocessed_extensions
                                        (options,tokens,uVar3,json_chunk,out_extensions_count,
                                         out_extensions);
                      goto LAB_001116f7;
                    }
                  }
                  uVar3 = cgltf_skip_json(tokens,uVar3 + 1);
                  goto LAB_001116f7;
                }
                if (pjVar1[1].type != JSMN_OBJECT) goto LAB_00111730;
                iVar4 = pjVar1[1].size;
                uVar3 = uVar3 + 2;
                out_string->type = cgltf_camera_type_orthographic;
                if (0 < iVar4) {
                  do {
                    if ((tokens[uVar3].type != JSMN_STRING) ||
                       (pjVar1 = tokens + uVar3, pjVar1->size == 0)) goto LAB_00111730;
                    iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"xmag");
                    if (iVar6 == 0) {
                      cVar9 = cgltf_json_to_float(tokens + (long)(int)uVar3 + 1,json_chunk);
                      (out_string->data).perspective.aspect_ratio = cVar9;
LAB_00111685:
                      uVar3 = uVar3 + 2;
                    }
                    else {
                      iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"ymag");
                      if (iVar6 == 0) {
                        cVar9 = cgltf_json_to_float(tokens + (long)(int)uVar3 + 1,json_chunk);
                        (out_string->data).perspective.yfov = cVar9;
                        goto LAB_00111685;
                      }
                      iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"zfar");
                      if (iVar6 == 0) {
                        cVar9 = cgltf_json_to_float(tokens + (long)(int)uVar3 + 1,json_chunk);
                        (out_string->data).perspective.zfar = cVar9;
                        goto LAB_00111685;
                      }
                      iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"znear");
                      if (iVar6 == 0) {
                        cVar9 = cgltf_json_to_float(tokens + (long)(int)uVar3 + 1,json_chunk);
                        (out_string->data).perspective.znear = cVar9;
                        goto LAB_00111685;
                      }
                      iVar6 = cgltf_json_strcmp(pjVar1,json_chunk,"extras");
                      uVar3 = uVar3 + 1;
                      if (iVar6 == 0) {
                        *(long *)((long)&out_string->data + 0x10) = (long)tokens[uVar3].start;
                        *(long *)((long)&out_string->data + 0x18) = (long)tokens[uVar3].end;
                      }
                      uVar3 = cgltf_skip_json(tokens,uVar3);
                    }
                    if ((int)uVar3 < 0) {
                      return uVar3;
                    }
                    iVar4 = iVar4 + -1;
                  } while (iVar4 != 0);
                }
              }
            }
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar2);
        uVar7 = *out_array;
      }
      local_68 = local_68 + 1;
      if (uVar7 <= local_68) {
        return uVar3;
      }
    }
LAB_00111730:
    uVar3 = 0xffffffff;
  }
  return uVar3;
}

Assistant:

static int cgltf_parse_json_cameras(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_data* out_data)
{
	i = cgltf_parse_json_array(options, tokens, i, json_chunk, sizeof(cgltf_camera), (void**)&out_data->cameras, &out_data->cameras_count);
	if (i < 0)
	{
		return i;
	}

	for (cgltf_size j = 0; j < out_data->cameras_count; ++j)
	{
		i = cgltf_parse_json_camera(options, tokens, i, json_chunk, &out_data->cameras[j]);
		if (i < 0)
		{
			return i;
		}
	}
	return i;
}